

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O0

int32_t icu_63::MeasureUnit::internalGetIndexForTypeAndSubtype(char *type,char *subtype)

{
  int32_t iVar1;
  int32_t st;
  int32_t t;
  char *subtype_local;
  char *type_local;
  
  iVar1 = binarySearch((char **)gTypes,0,0x14,type);
  type_local._4_4_ = iVar1;
  if ((-1 < iVar1) &&
     (type_local._4_4_ =
           binarySearch((char **)gSubTypes,*(int32_t *)(gOffsets + (long)iVar1 * 4),
                        *(int32_t *)(gOffsets + (long)(iVar1 + 1) * 4),subtype),
     -1 < type_local._4_4_)) {
    type_local._4_4_ =
         (*(int *)(gIndexes + (long)iVar1 * 4) + type_local._4_4_) -
         *(int *)(gOffsets + (long)iVar1 * 4);
  }
  return type_local._4_4_;
}

Assistant:

int32_t MeasureUnit::internalGetIndexForTypeAndSubtype(const char *type, const char *subtype) {
    int32_t t = binarySearch(gTypes, 0, UPRV_LENGTHOF(gTypes), type);
    if (t < 0) {
        return t;
    }
    int32_t st = binarySearch(gSubTypes, gOffsets[t], gOffsets[t + 1], subtype);
    if (st < 0) {
        return st;
    }
    return gIndexes[t] + st - gOffsets[t];
}